

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O0

void Hex::Hexdumper<unsigned_long>::output_bin(ostream *os,remove_const_t<unsigned_long> val)

{
  _Setw _Var1;
  streamsize sVar2;
  undefined1 local_142;
  int local_140;
  int i;
  char local_131;
  int iStack_12c;
  char fill;
  int width;
  int len;
  char bits [257];
  ulong local_18;
  remove_const_t<unsigned_long> val_local;
  ostream *os_local;
  
  iStack_12c = 0;
  for (local_18 = val; local_18 != 0 && iStack_12c < 0x100; local_18 = local_18 >> 1) {
    local_142 = 0x31;
    if ((local_18 & 1) == 0) {
      local_142 = 0x30;
    }
    *(undefined1 *)((long)&width + (long)iStack_12c) = local_142;
    iStack_12c = iStack_12c + 1;
  }
  *(undefined1 *)((long)&width + (long)iStack_12c) = 0;
  sVar2 = std::ios_base::width((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
  local_131 = std::ios::fill();
  if (local_131 == '\0') {
    local_131 = ' ';
  }
  local_140 = iStack_12c;
  if (iStack_12c < (int)sVar2) {
    _Var1 = std::setw((int)sVar2 - iStack_12c);
    std::operator<<(os,_Var1);
    std::operator<<(os,local_131);
  }
  else {
    _Var1 = std::setw(0);
    std::operator<<(os,_Var1);
  }
  while (local_140 = local_140 + -1, -1 < local_140) {
    std::operator<<(os,*(char *)((long)&width + (long)local_140));
  }
  return;
}

Assistant:

static void output_bin(std::ostream& os, std::remove_const_t<T> val)
    {
        char bits[257];
        int len = 0;
        while (val && len<256) {
            bits[len++] = (val&1) ? '1' : '0';
            val >>= 1;
        }
        bits[len] = 0;

        int width = os.width();
        char fill = os.fill();
        if (!fill) fill = ' ';
        if (width>len) {
            os << std::setw(width-len);
            os << fill;
        }
        else {
            os << std::setw(0);
        }

        for (int i=len-1 ; i>=0 ; i--)
            os << bits[i];
    }